

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

TestInstance * __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::createInstance
          (LinearDerivateCase *this,Context *context)

{
  TestInstance *this_00;
  UniformSetup *uniformSetup;
  Context *context_local;
  LinearDerivateCase *this_local;
  
  this_00 = (TestInstance *)operator_new(0x220);
  uniformSetup = de::details::
                 UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                 ::operator*(&(this->super_TriangleDerivateCase).super_ShaderRenderCase.
                              m_uniformSetup.
                              super_UniqueBase<const_vkt::sr::UniformSetup,_de::DefaultDeleter<const_vkt::sr::UniformSetup>_>
                            );
  LinearDerivateCaseInstance::LinearDerivateCaseInstance
            ((LinearDerivateCaseInstance *)this_00,context,uniformSetup,
             &(this->super_TriangleDerivateCase).m_definitions,
             &(this->super_TriangleDerivateCase).m_values);
  return this_00;
}

Assistant:

TestInstance* LinearDerivateCase::createInstance (Context& context) const
{
	DE_ASSERT(m_uniformSetup != DE_NULL);
	return new LinearDerivateCaseInstance(context, *m_uniformSetup, m_definitions, m_values);
}